

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O0

int LzInWindow_Create(CMatchFinder *p,UInt32 keepSizeReserv,ISzAlloc *alloc)

{
  int iVar1;
  undefined8 uVar2;
  CMatchFinder *in_RDX;
  int in_ESI;
  long in_RDI;
  UInt32 blockSize;
  undefined4 in_stack_ffffffffffffffd8;
  uint local_4;
  
  iVar1 = *(int *)(in_RDI + 0x54) + *(int *)(in_RDI + 0x58) + in_ESI;
  if (*(char *)(in_RDI + 0x23) == '\0') {
    if ((*(long *)(in_RDI + 0x40) == 0) || (*(int *)(in_RDI + 0x50) != iVar1)) {
      LzInWindow_Free(in_RDX,(ISzAlloc *)CONCAT44(iVar1,in_stack_ffffffffffffffd8));
      *(int *)(in_RDI + 0x50) = iVar1;
      uVar2 = (*(code *)in_RDX->buffer)(in_RDX,iVar1);
      *(undefined8 *)(in_RDI + 0x40) = uVar2;
    }
    local_4 = (uint)(*(long *)(in_RDI + 0x40) != 0);
  }
  else {
    *(int *)(in_RDI + 0x50) = iVar1;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int LzInWindow_Create(CMatchFinder *p, UInt32 keepSizeReserv, ISzAlloc *alloc)
{
  UInt32 blockSize = p->keepSizeBefore + p->keepSizeAfter + keepSizeReserv;
  if (p->directInput)
  {
    p->blockSize = blockSize;
    return 1;
  }
  if (!p->bufferBase || p->blockSize != blockSize)
  {
    LzInWindow_Free(p, alloc);
    p->blockSize = blockSize;
    p->bufferBase = (Byte *)alloc->Alloc(alloc, (size_t)blockSize);
  }
  return (p->bufferBase != NULL);
}